

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackIFWInstaller.cxx
# Opt level: O1

void __thiscall
cmCPackIFWInstaller::printSkippedOptionWarning
          (cmCPackIFWInstaller *this,string *optionName,string *optionValue)

{
  cmCPackIFWGenerator *pcVar1;
  cmCPackLog *this_00;
  ostream *poVar2;
  size_t length;
  ostringstream cmCPackLog_msg;
  long *local_1b8;
  long local_1a8 [2];
  undefined1 local_198 [376];
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_198);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,"Option ",7);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_198,(optionName->_M_dataplus)._M_p,
                      optionName->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," contains the value \"",0x15);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar2,(optionValue->_M_dataplus)._M_p,optionValue->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar2,"\" but will be skipped because the specified file does not exist.",0x40);
  std::ios::widen((char)poVar2->_vptr_basic_ostream[-3] + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  pcVar1 = (this->super_cmCPackIFWCommon).Generator;
  if (pcVar1 != (cmCPackIFWGenerator *)0x0) {
    this_00 = (pcVar1->super_cmCPackGenerator).Logger;
    std::__cxx11::stringbuf::str();
    length = strlen((char *)local_1b8);
    cmCPackLog::Log(this_00,8,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CPack/IFW/cmCPackIFWInstaller.cxx"
                    ,0x1f,(char *)local_1b8,length);
    if (local_1b8 != local_1a8) {
      operator_delete(local_1b8,local_1a8[0] + 1);
    }
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_198);
  std::ios_base::~ios_base((ios_base *)(local_198 + 0x70));
  return;
}

Assistant:

void cmCPackIFWInstaller::printSkippedOptionWarning(
  const std::string& optionName, const std::string& optionValue)
{
  cmCPackIFWLogger(
    WARNING,
    "Option "
      << optionName << " contains the value \"" << optionValue
      << "\" but will be skipped because the specified file does not exist."
      << std::endl);
}